

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_append_maxkey(void)

{
  char cVar1;
  bson_t *a;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  cVar1 = bson_append_maxkey(a,"maxkey",0xffffffffffffffff);
  if (cVar1 != '\0') {
    b = get_bson("test37.bson");
    BSON_ASSERT_BSON_EQUAL(a,b);
    bson_destroy(a);
    bson_destroy(b);
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          0x2a4,"test_bson_append_maxkey","bson_append_maxkey (b, \"maxkey\", -1)");
  abort();
}

Assistant:

static void
test_bson_append_maxkey (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   b2 = get_bson ("test37.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}